

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ec_pubkey_serialize
              (secp256k1_context *ctx,uchar *output,size_t *outputlen,secp256k1_pubkey *pubkey,
              uint flags)

{
  int iVar1;
  size_t len;
  secp256k1_ge Q;
  ulong local_98;
  uchar *local_90;
  secp256k1_ge local_88;
  
  if (outputlen == (size_t *)0x0) {
    secp256k1_ec_pubkey_serialize_cold_5();
  }
  else {
    local_98 = *outputlen;
    if (local_98 < (ulong)((flags & 0x100) == 0) * 0x20 + 0x21) {
      secp256k1_ec_pubkey_serialize_cold_4();
    }
    else {
      *outputlen = 0;
      if (output == (uchar *)0x0) {
        secp256k1_ec_pubkey_serialize_cold_3();
      }
      else {
        local_90 = output;
        memset(output,0,local_98);
        if (pubkey == (secp256k1_pubkey *)0x0) {
          secp256k1_ec_pubkey_serialize_cold_2();
          return 0;
        }
        if ((char)flags == '\x02') {
          iVar1 = secp256k1_pubkey_load(ctx,&local_88,pubkey);
          if (iVar1 == 0) {
            return 0;
          }
          iVar1 = secp256k1_eckey_pubkey_serialize
                            (&local_88,local_90,&local_98,(flags & 0x100) >> 8);
          if (iVar1 == 0) {
            return 0;
          }
          *outputlen = local_98;
          return 1;
        }
        secp256k1_ec_pubkey_serialize_cold_1();
      }
    }
  }
  return 0;
}

Assistant:

int secp256k1_ec_pubkey_serialize(const secp256k1_context* ctx, unsigned char *output, size_t *outputlen, const secp256k1_pubkey* pubkey, unsigned int flags) {
    secp256k1_ge Q;
    size_t len;
    int ret = 0;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(outputlen != NULL);
    ARG_CHECK(*outputlen >= ((flags & SECP256K1_FLAGS_BIT_COMPRESSION) ? 33u : 65u));
    len = *outputlen;
    *outputlen = 0;
    ARG_CHECK(output != NULL);
    memset(output, 0, len);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK((flags & SECP256K1_FLAGS_TYPE_MASK) == SECP256K1_FLAGS_TYPE_COMPRESSION);
    if (secp256k1_pubkey_load(ctx, &Q, pubkey)) {
        ret = secp256k1_eckey_pubkey_serialize(&Q, output, &len, !!(flags & SECP256K1_FLAGS_BIT_COMPRESSION));
        if (ret) {
            *outputlen = len;
        }
    }
    return ret;
}